

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O1

void __thiscall PresolveComponentData::~PresolveComponentData(PresolveComponentData *this)

{
  this->_vptr_PresolveComponentData = (_func_int **)&PTR__PresolveComponentData_00159b08;
  if (*(void **)&this->presolve_log_ != (void *)0x0) {
    operator_delete(*(void **)&this->presolve_log_);
  }
  if (*(void **)&this->field_0x538 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x538);
  }
  if (*(void **)&this->field_0x520 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x520);
  }
  if (*(undefined1 **)&this->field_0x500 != &this->field_0x510) {
    operator_delete(*(undefined1 **)&this->field_0x500);
  }
  if (*(void **)&this->field_0x4d8 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x4d8);
  }
  if (*(void **)&this->field_0x4c0 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x4c0);
  }
  if (*(void **)&this->field_0x4a8 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x4a8);
  }
  if (*(void **)&this->field_0x490 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x490);
  }
  if (*(void **)&this->field_0x468 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x468);
  }
  if (*(void **)&this->field_0x450 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x450);
  }
  if (*(void **)&this->field_0x438 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x438);
  }
  if (*(void **)&this->field_0x420 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x420);
  }
  if (*(void **)&this->field_0x408 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x408);
  }
  if (*(void **)&this->field_0x3f0 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x3f0);
  }
  if (*(void **)&this->field_0x3d0 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x3d0);
  }
  HighsLp::~HighsLp(&this->reduced_lp_);
  return;
}

Assistant:

virtual ~PresolveComponentData() = default;